

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall google::protobuf::Descriptor::CopyHeadingTo(Descriptor *this,DescriptorProto *proto)

{
  string_view value;
  int iVar1;
  DescriptorProto *pDVar2;
  int iVar3;
  SymbolVisibility SVar4;
  uint32_t *puVar5;
  Arena *arena;
  DescriptorProto_ReservedRange *pDVar6;
  ReservedRange *pRVar7;
  MessageOptions *pMVar8;
  MessageOptions *pMVar9;
  string_view local_78;
  int local_64;
  DescriptorProto_ReservedRange *pDStack_60;
  int i_1;
  ReservedRange *range;
  undefined1 auStack_50 [4];
  int i;
  DescriptorProto *local_40;
  DescriptorProto *proto_local;
  Descriptor *this_local;
  char *local_28;
  undefined8 *local_20;
  DescriptorProto *local_18;
  anon_union_224_1_493b367e_for_DescriptorProto_3 *local_10;
  
  local_40 = proto;
  proto_local = (DescriptorProto *)this;
  _auStack_50 = name(this);
  local_20 = (undefined8 *)auStack_50;
  local_10 = &proto->field_0;
  local_18 = proto;
  puVar5 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar5 = *puVar5 | 1;
  this_local = (Descriptor *)*local_20;
  local_28 = (char *)local_20[1];
  arena = MessageLite::GetArena((MessageLite *)proto);
  value._M_str = local_28;
  value._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  range._4_4_ = 0;
  while( true ) {
    iVar1 = range._4_4_;
    iVar3 = reserved_range_count(this);
    if (iVar3 <= iVar1) break;
    pDVar6 = DescriptorProto::add_reserved_range(local_40);
    pDStack_60 = pDVar6;
    pRVar7 = reserved_range(this,range._4_4_);
    DescriptorProto_ReservedRange::set_start(pDVar6,pRVar7->start);
    pDVar6 = pDStack_60;
    pRVar7 = reserved_range(this,range._4_4_);
    DescriptorProto_ReservedRange::set_end(pDVar6,pRVar7->end);
    range._4_4_ = range._4_4_ + 1;
  }
  local_64 = 0;
  while( true ) {
    iVar1 = local_64;
    iVar3 = reserved_name_count(this);
    pDVar2 = local_40;
    if (iVar3 <= iVar1) break;
    local_78 = reserved_name(this,local_64);
    DescriptorProto::add_reserved_name<std::basic_string_view<char,std::char_traits<char>>>
              (pDVar2,&local_78);
    local_64 = local_64 + 1;
  }
  pMVar8 = options(this);
  pMVar9 = MessageOptions::default_instance();
  if (pMVar8 != pMVar9) {
    pMVar8 = options(this);
    pMVar9 = DescriptorProto::mutable_options(local_40);
    MessageOptions::operator=(pMVar9,pMVar8);
  }
  SVar4 = visibility_keyword(this);
  pDVar2 = local_40;
  if (SVar4 != VISIBILITY_UNSET) {
    SVar4 = visibility_keyword(this);
    DescriptorProto::set_visibility(pDVar2,SVar4);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::DescriptorProto>
            (this->proto_features_,local_40);
  return;
}

Assistant:

void Descriptor::CopyHeadingTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    *proto->mutable_options() = options();
  }

  if (visibility_keyword() != SymbolVisibility::VISIBILITY_UNSET) {
    proto->set_visibility(visibility_keyword());
  }

  RestoreFeaturesToOptions(proto_features_, proto);
}